

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

void b_array::split<BPlusTree<Map::Pair<std::__cxx11::string,sql_parser::Keyword>>*>
               (Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>_*>
                *data1,size_t *size1,
               Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>_*>
               *data2,size_t *size2)

{
  ulong uVar1;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  *pBVar2;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>
  **ppBVar3;
  ulong uVar4;
  size_t sVar5;
  size_t index;
  
  uVar1 = *size1;
  uVar4 = uVar1 + 1 >> 1;
  sVar5 = uVar1 - uVar4;
  if (uVar4 <= uVar1 && sVar5 != 0) {
    index = 0;
    do {
      ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>_*>
                ::operator[](data1,uVar4 + index);
      pBVar2 = *ppBVar3;
      ppBVar3 = Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sql_parser::Keyword>_>_*>
                ::operator[](data2,index);
      *ppBVar3 = pBVar2;
      index = index + 1;
    } while (sVar5 != index);
  }
  *size1 = uVar4;
  *size2 = sVar5;
  return;
}

Assistant:

void split(b_array::Array<T>& data1, size_t& size1, b_array::Array<T>& data2, size_t& size2) {
    size_t size = size1;
    for (size_t i = ((size + 1) / 2); i < size; i++) {
        data2[i - ((size + 1) / 2)] = data1[i];
    }
    size1 = (size + 1) / 2;
    size2 = size - size1;
}